

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aistr.cpp
# Opt level: O2

void __thiscall Test_aistr_length_Test::TestBody(Test_aistr_length_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_30;
  AssertHelper local_28;
  AssertionResult gtest_ar;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    ai::length((char *)0x0,10);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            (&local_30,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
             ,0x22,
             "Expected: ai::length(nullptr, 10) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_30,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  pcVar2 = "";
  local_30.data_ = (AssertHelperData *)ai::length("",10);
  local_28.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"ai::length(\"\", 10)","0",(unsigned_long *)&local_30,
             (int *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_30.data_ = (AssertHelperData *)ai::length("1234",10);
    local_28.data_._0_4_ = 4;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&gtest_ar,"ai::length(\"1234\", 10)","4",(unsigned_long *)&local_30,
               (int *)&local_28);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_30);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                 ,0x24,pcVar2);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_30.data_ = (AssertHelperData *)ai::length("123456789",9);
      local_28.data_._0_4_ = 9;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)&gtest_ar,"ai::length(\"123456789\", 9)","9",(unsigned_long *)&local_30
                 ,(int *)&local_28);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_30);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                   ,0x25,pcVar2);
        testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        local_30.data_ = (AssertHelperData *)ai::length("1234567890",10);
        local_28.data_._0_4_ = 10;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)&gtest_ar,"ai::length(\"1234567890\", 10)","10",
                   (unsigned_long *)&local_30,(int *)&local_28);
        if (gtest_ar.success_ != false) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          local_30.data_ = (AssertHelperData *)ai::length("12345678901",10);
          local_28.data_._0_4_ = 10;
          testing::internal::CmpHelperEQ<unsigned_long,int>
                    ((internal *)&gtest_ar,"ai::length(\"12345678901\", 10)","10",
                     (unsigned_long *)&local_30,(int *)&local_28);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_30);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_28,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                       ,0x27,pcVar2);
            testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
            testing::internal::AssertHelper::~AssertHelper(&local_28);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_30);
          }
          goto LAB_0010d3ab;
        }
        testing::Message::Message((Message *)&local_30);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aistr.cpp"
                   ,0x26,pcVar2);
        testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_28);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_30);
LAB_0010d3ab:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(Test_aistr, length) {
    EXPECT_THROW(ai::length(nullptr, 10), std::invalid_argument);
    ASSERT_EQ(ai::length("", 10), 0);
    ASSERT_EQ(ai::length("1234", 10), 4);
    ASSERT_EQ(ai::length("123456789", 9), 9);
    ASSERT_EQ(ai::length("1234567890", 10), 10);
    ASSERT_EQ(ai::length("12345678901", 10), 10);
}